

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O1

void __thiscall
tchecker::
variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::declare(variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,uint id,string *name,clock_info_t *info)

{
  invalid_argument *this_00;
  long *plVar1;
  long *plVar2;
  uint local_84;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_38;
  
  local_84 = id;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add(&this->_index,&local_84,name);
  local_80 = (long *)CONCAT44((info->super_size_info_t)._size,local_84);
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>_>_>
  ::insert_unique((flat_tree<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>_>_>
                   *)&stack0xffffffffffffffc0,(value_type *)&this->_info);
  if (local_38 != '\0') {
    return;
  }
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::erase(&this->_index,&local_84);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Variable ",name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_80 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_80 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_80);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void declare(ID id, std::string const & name, INFO const & info)
  {
    try {
      _index.add(id, name);
      auto && ok = _info.insert(std::make_pair(id, info)).second;
      if (!ok) {
        _index.erase(id);
        throw std::invalid_argument("Variable " + name + " cannot be declared");
      }
    }
    catch (std::exception const & e) {
      throw std::invalid_argument("Variable " + name + " cannot be declared");
    }
  }